

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderMD.cpp
# Opt level: O0

void __thiscall
EncoderMD::FixMaps(EncoderMD *this,uint32 brOffset,uint32 bytesSaved,FixUpMapIndex *mapIndices)

{
  List<InlineeFrameRecord_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  List<IR::PragmaInstr_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_02;
  List<LazyBailOutRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_03;
  uint32 *puVar1;
  bool bVar2;
  int iVar3;
  Type *ppIVar4;
  Type *pTVar5;
  Type *ppPVar6;
  Type *pTVar7;
  ArenaLazyBailoutRecordList *lazyBailOutRecordList;
  PragmaInstrList *pInstrList;
  ArenaInlineeFrameMap *mapList;
  InlineeFrameRecords *recList;
  int32 i;
  FixUpMapIndex *mapIndices_local;
  uint32 bytesSaved_local;
  uint32 brOffset_local;
  EncoderMD *this_local;
  
  this_00 = this->m_encoder->m_inlineeFrameRecords;
  recList._4_4_ = mapIndices->inlineeFrameRecordsIndex;
  while( true ) {
    iVar3 = JsUtil::ReadOnlyList<InlineeFrameRecord_*,_Memory::ArenaAllocator,_DefaultComparer>::
            Count(&this_00->
                   super_ReadOnlyList<InlineeFrameRecord_*,_Memory::ArenaAllocator,_DefaultComparer>
                 );
    bVar2 = false;
    if ((int)recList._4_4_ < iVar3) {
      ppIVar4 = JsUtil::
                List<InlineeFrameRecord_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_00,recList._4_4_);
      bVar2 = (*ppIVar4)->inlineeStartOffset <= brOffset;
    }
    if (!bVar2) break;
    ppIVar4 = JsUtil::
              List<InlineeFrameRecord_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_00,recList._4_4_);
    (*ppIVar4)->inlineeStartOffset = (*ppIVar4)->inlineeStartOffset - bytesSaved;
    recList._4_4_ = recList._4_4_ + 1;
  }
  mapIndices->inlineeFrameRecordsIndex = recList._4_4_;
  this_01 = this->m_encoder->m_inlineeFrameMap;
  recList._4_4_ = mapIndices->inlineeFrameMapIndex;
  while( true ) {
    iVar3 = JsUtil::
            ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>::
            Count(&this_01->
                   super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>
                 );
    bVar2 = false;
    if ((int)recList._4_4_ < iVar3) {
      pTVar5 = JsUtil::
               List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_01,recList._4_4_);
      bVar2 = pTVar5->offset <= brOffset;
    }
    if (!bVar2) break;
    pTVar5 = JsUtil::
             List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(this_01,recList._4_4_);
    pTVar5->offset = pTVar5->offset - bytesSaved;
    recList._4_4_ = recList._4_4_ + 1;
  }
  mapIndices->inlineeFrameMapIndex = recList._4_4_;
  this_02 = this->m_encoder->m_pragmaInstrToRecordOffset;
  recList._4_4_ = mapIndices->pragmaInstToRecordOffsetIndex;
  while( true ) {
    iVar3 = JsUtil::ReadOnlyList<IR::PragmaInstr_*,_Memory::ArenaAllocator,_DefaultComparer>::Count
                      (&this_02->
                        super_ReadOnlyList<IR::PragmaInstr_*,_Memory::ArenaAllocator,_DefaultComparer>
                      );
    bVar2 = false;
    if ((int)recList._4_4_ < iVar3) {
      ppPVar6 = JsUtil::
                List<IR::PragmaInstr_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_02,recList._4_4_);
      bVar2 = (*ppPVar6)->m_offsetInBuffer <= brOffset;
    }
    if (!bVar2) break;
    ppPVar6 = JsUtil::
              List<IR::PragmaInstr_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_02,recList._4_4_);
    (*ppPVar6)->m_offsetInBuffer = (*ppPVar6)->m_offsetInBuffer - bytesSaved;
    recList._4_4_ = recList._4_4_ + 1;
  }
  mapIndices->pragmaInstToRecordOffsetIndex = recList._4_4_;
  this_03 = this->m_encoder->m_sortedLazyBailoutRecordList;
  recList._4_4_ = mapIndices->lazyBailOutRecordListIndex;
  while( true ) {
    iVar3 = JsUtil::ReadOnlyList<LazyBailOutRecord,_Memory::ArenaAllocator,_DefaultComparer>::Count
                      (&this_03->
                        super_ReadOnlyList<LazyBailOutRecord,_Memory::ArenaAllocator,_DefaultComparer>
                      );
    bVar2 = false;
    if ((int)recList._4_4_ < iVar3) {
      pTVar7 = JsUtil::
               List<LazyBailOutRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_03,recList._4_4_);
      bVar2 = pTVar7->offset <= brOffset;
    }
    if (!bVar2) break;
    pTVar7 = JsUtil::
             List<LazyBailOutRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(this_03,recList._4_4_);
    pTVar7->offset = pTVar7->offset - bytesSaved;
    recList._4_4_ = recList._4_4_ + 1;
  }
  mapIndices->lazyBailOutRecordListIndex = recList._4_4_;
  recList._4_4_ = mapIndices->offsetBuffIndex;
  while( true ) {
    bVar2 = false;
    if (recList._4_4_ < this->m_encoder->m_instrNumber) {
      bVar2 = this->m_encoder->m_offsetBuffer[(int)recList._4_4_] <= brOffset;
    }
    if (!bVar2) break;
    puVar1 = this->m_encoder->m_offsetBuffer;
    puVar1[(int)recList._4_4_] = puVar1[(int)recList._4_4_] - bytesSaved;
    recList._4_4_ = recList._4_4_ + 1;
  }
  mapIndices->offsetBuffIndex = recList._4_4_;
  return;
}

Assistant:

void
EncoderMD::FixMaps(uint32 brOffset, uint32 bytesSaved, FixUpMapIndex *mapIndices)

{
    int32 i;

    {
        InlineeFrameRecords *recList = m_encoder->m_inlineeFrameRecords;
        for (i = mapIndices->inlineeFrameRecordsIndex; i < recList->Count() && recList->Item(i)->inlineeStartOffset <= brOffset; i++)
        {
            recList->Item(i)->inlineeStartOffset -= bytesSaved;
        }

        mapIndices->inlineeFrameRecordsIndex = i;
    }

    {
        ArenaInlineeFrameMap *mapList = m_encoder->m_inlineeFrameMap;
        for (i = mapIndices->inlineeFrameMapIndex; i < mapList->Count() && mapList->Item(i).offset <= brOffset; i++)
        {
            mapList->Item(i).offset -= bytesSaved;
        }

        mapIndices->inlineeFrameMapIndex = i;
    }

    {
        PragmaInstrList *pInstrList = m_encoder->m_pragmaInstrToRecordOffset;
        for (i = mapIndices->pragmaInstToRecordOffsetIndex; i < pInstrList->Count() && pInstrList->Item(i)->m_offsetInBuffer <= brOffset; i++)
        {
            pInstrList->Item(i)->m_offsetInBuffer -= bytesSaved;
        }

        mapIndices->pragmaInstToRecordOffsetIndex = i;
    }

    {
        ArenaLazyBailoutRecordList *lazyBailOutRecordList = m_encoder->m_sortedLazyBailoutRecordList;
        for (i = mapIndices->lazyBailOutRecordListIndex; i < lazyBailOutRecordList->Count() && lazyBailOutRecordList->Item(i).offset <= brOffset; i++)
        {
            lazyBailOutRecordList->Item(i).offset -= bytesSaved;
        }

        mapIndices->lazyBailOutRecordListIndex = i;
    }

#if DBG_DUMP

    {
        for (i = mapIndices->offsetBuffIndex; (uint)i < m_encoder->m_instrNumber && m_encoder->m_offsetBuffer[i] <= brOffset; i++)
        {
            m_encoder->m_offsetBuffer[i] -= bytesSaved;
        }

        mapIndices->offsetBuffIndex = i;
    }

#endif
}